

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_byteArray_primitive_int32At
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar3 = (ulong)*(uint *)(uVar1 + 0xc);
  }
  else {
    uVar3 = 0;
  }
  uVar2 = arguments[1];
  if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
    lVar4 = (long)uVar2 >> 4;
  }
  else {
    lVar4 = *(long *)(uVar2 + 0x10);
  }
  if (uVar3 < lVar4 + 4U) {
    sysbvm_error_outOfBoundsSlotAccess();
  }
  return (long)*(int *)(uVar1 + 0x10 + lVar4) << 4 | 10;
}

Assistant:

static sysbvm_tuple_t sysbvm_byteArray_primitive_int32At(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_byteArray_t *array = (sysbvm_byteArray_t *)arguments[0];
    size_t size = sysbvm_tuple_getSizeInBytes(arguments[0]);
    size_t index = sysbvm_tuple_size_decode(arguments[1]);
    if(index + 4 > size) sysbvm_error_outOfBoundsSlotAccess();

    return sysbvm_tuple_int32_encode(context, *(int32_t*)(array->elements + index));
}